

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

char * faidx_fetch_seq(faidx_t *fai,char *c_name,int p_beg_i,int p_end_i,int *len)

{
  khint_t kVar1;
  uint uVar2;
  kh_s_t *pkVar3;
  khint32_t *pkVar4;
  faidx1_t *pfVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  ushort **ppuVar9;
  long lVar10;
  byte bVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  
  pkVar3 = fai->hash;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    uVar7 = 0;
  }
  else {
    uVar16 = (uint)*c_name;
    if (*c_name == '\0') {
      uVar16 = 0;
    }
    else {
      cVar6 = c_name[1];
      if (cVar6 != '\0') {
        pcVar12 = c_name + 2;
        do {
          uVar16 = (int)cVar6 + uVar16 * 0x1f;
          cVar6 = *pcVar12;
          pcVar12 = pcVar12 + 1;
        } while (cVar6 != '\0');
      }
    }
    uVar16 = uVar16 & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar15 = 1;
    uVar14 = uVar16;
    do {
      uVar2 = pkVar4[uVar14 >> 4];
      bVar11 = (char)uVar14 * '\x02' & 0x1e;
      uVar7 = uVar2 >> bVar11;
      if (((uVar7 & 2) != 0) ||
         (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar3->keys[uVar14],c_name), iVar8 == 0)))) {
        uVar7 = uVar14;
        if ((uVar2 >> bVar11 & 3) != 0) {
          uVar7 = kVar1;
        }
        break;
      }
      uVar14 = uVar14 + iVar15 & kVar1 - 1;
      iVar15 = iVar15 + 1;
      uVar7 = kVar1;
    } while (uVar14 != uVar16);
  }
  if (uVar7 == kVar1) {
    *len = -2;
    pcVar12 = (char *)0x0;
    fprintf(_stderr,"[fai_fetch_seq] The sequence \"%s\" not found\n",c_name);
  }
  else {
    pfVar5 = pkVar3->vals;
    if (p_end_i < p_beg_i) {
      p_beg_i = p_end_i;
    }
    lVar10 = pfVar5[uVar7].len;
    uVar16 = 0;
    if ((-1 < p_beg_i) && (uVar16 = p_beg_i, lVar10 <= (long)(ulong)(uint)p_beg_i)) {
      uVar16 = (int)lVar10 - 1;
    }
    iVar15 = 0;
    if ((-1 < p_end_i) && (iVar15 = p_end_i, lVar10 <= (long)(ulong)(uint)p_end_i)) {
      iVar15 = (int)lVar10 + -1;
    }
    iVar13 = 0;
    iVar8 = bgzf_useek(fai->bgzf,
                       pfVar5[uVar7].offset + (long)((int)uVar16 % pfVar5[uVar7].line_blen) +
                       (long)((int)uVar16 / pfVar5[uVar7].line_blen) * (long)pfVar5[uVar7].line_len,
                       0);
    if (iVar8 < 0) {
      faidx_fetch_seq_cold_1();
      pcVar12 = (char *)0x0;
    }
    else {
      uVar16 = iVar15 - uVar16;
      pcVar12 = (char *)malloc((long)(int)(uVar16 + 2));
      uVar7 = bgzf_getc(fai->bgzf);
      if (-1 < (int)(uVar7 | uVar16)) {
        iVar13 = 0;
        ppuVar9 = __ctype_b_loc();
        do {
          if ((short)(*ppuVar9)[uVar7] < 0) {
            lVar10 = (long)iVar13;
            iVar13 = iVar13 + 1;
            pcVar12[lVar10] = (char)uVar7;
          }
          uVar7 = bgzf_getc(fai->bgzf);
        } while ((-1 < (int)uVar7) && (iVar13 <= (int)uVar16));
      }
      pcVar12[iVar13] = '\0';
      *len = iVar13;
    }
  }
  return pcVar12;
}

Assistant:

char *faidx_fetch_seq(const faidx_t *fai, const char *c_name, int p_beg_i, int p_end_i, int *len)
{
    int l, c;
    khiter_t iter;
    faidx1_t val;
    char *seq=NULL;

    // Adjust position
    iter = kh_get(s, fai->hash, c_name);
    if (iter == kh_end(fai->hash))
    {
        *len = -2;
        fprintf(stderr, "[fai_fetch_seq] The sequence \"%s\" not found\n", c_name);
        return NULL;
    }
    val = kh_value(fai->hash, iter);
    if(p_end_i < p_beg_i) p_beg_i = p_end_i;
    if(p_beg_i < 0) p_beg_i = 0;
    else if(val.len <= p_beg_i) p_beg_i = val.len - 1;
    if(p_end_i < 0) p_end_i = 0;
    else if(val.len <= p_end_i) p_end_i = val.len - 1;

    // Now retrieve the sequence
    int ret = bgzf_useek(fai->bgzf, val.offset + p_beg_i / val.line_blen * val.line_len + p_beg_i % val.line_blen, SEEK_SET);
    if ( ret<0 )
    {
        *len = -1;
        fprintf(stderr, "[fai_fetch_seq] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n");
        return NULL;
    }
    l = 0;
    seq = (char*)malloc(p_end_i - p_beg_i + 2);
    while ( (c=bgzf_getc(fai->bgzf))>=0 && l < p_end_i - p_beg_i + 1)
        if (isgraph(c)) seq[l++] = c;
    seq[l] = '\0';
    *len = l;
    return seq;
}